

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_label.cc
# Opt level: O3

size_t read_cached_simple_label(shared_data *sd,void *v,io_buf *cache)

{
  size_t sVar1;
  size_t sVar2;
  char *c;
  char *local_20;
  
  sVar2 = 0xc;
  sVar1 = io_buf::buf_read(cache,&local_20,0xc);
  if (sVar1 < 0xc) {
    sVar2 = 0;
  }
  else {
    bufread_simple_label(sd,(label_data *)v,local_20);
  }
  return sVar2;
}

Assistant:

size_t read_cached_simple_label(shared_data* sd, void* v, io_buf& cache)
{
  label_data* ld = (label_data*)v;
  char* c;
  size_t total = sizeof(ld->label) + sizeof(ld->weight) + sizeof(ld->initial);
  if (cache.buf_read(c, total) < total)
    return 0;
  bufread_simple_label(sd, ld, c);

  return total;
}